

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

int ws_listener_get(void *arg,char *name,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  
  iVar1 = nni_getopt(ws_listener_options,name,arg,buf,szp,t);
  if (iVar1 == 9) {
    iVar1 = nni_http_server_get(*(nni_http_server **)((long)arg + 0x50),name,buf,szp,t);
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int
ws_listener_get(
    void *arg, const char *name, void *buf, size_t *szp, nni_type t)
{
	nni_ws_listener *l = arg;
	int              rv;

	rv = nni_getopt(ws_listener_options, name, l, buf, szp, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_http_server_get(l->server, name, buf, szp, t);
	}
	return (rv);
}